

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O1

void __thiscall Array::Array(Array *this,int width,int height)

{
  int **ppiVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  
  this->_vptr_Array = (_func_int **)&PTR__Array_00104d08;
  this->_width = width;
  this->_height = height;
  uVar3 = (long)height * 8;
  if (height < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppiVar1 = (int **)operator_new__(uVar3);
  this->_data = ppiVar1;
  if (0 < height) {
    uVar3 = (long)width << 2;
    if (width < 0) {
      uVar3 = 0xffffffffffffffff;
    }
    uVar4 = 0;
    do {
      piVar2 = (int *)operator_new__(uVar3);
      this->_data[uVar4] = piVar2;
      uVar4 = uVar4 + 1;
    } while ((uint)height != uVar4);
  }
  return;
}

Assistant:

Array::Array(int width, int height)
	:_width(width)
	,_height(height)
{
	_data = new int*[_height];

	for (int i = 0; i < _height; ++i) {
		_data[i] = new int[_width];
	}
}